

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

void * master_thread(void *thread_func_param)

{
  stop_flag_t *stop_flag;
  pthread_mutex_t *__mutex;
  undefined8 *puVar1;
  pollfd *pfd;
  pthread_t threadid;
  undefined8 uVar2;
  int iVar3;
  time_t tVar4;
  int *piVar5;
  char *pcVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  undefined4 *__optval;
  stop_flag_t *psVar10;
  mg_context *ctx;
  char *func;
  char *func_00;
  char *func_01;
  char *func_02;
  ulong uVar11;
  socklen_t len;
  undefined4 local_18c;
  socket so;
  undefined4 local_128 [4];
  undefined8 local_118;
  char src_addr [50];
  _union_1457 local_c8;
  undefined1 local_c0 [144];
  
  memset(local_c0,0,0x90);
  local_c8 = (_union_1457)0x1;
  sigaction(0xd,(sigaction *)&local_c8,(sigaction *)0x0);
  if (thread_func_param != (void *)0x0) {
    mg_set_thread_name("master");
    local_128[0] = 1;
    pthread_setspecific(sTlsKey,local_128);
    if (*(code **)((long)thread_func_param + 0x28388) == (code *)0x0) {
      local_118 = 0;
    }
    else {
      local_118 = (**(code **)((long)thread_func_param + 0x28388))();
    }
    tVar4 = time((time_t *)0x0);
    *(time_t *)((long)thread_func_param + 0x282e0) = tVar4;
    pfd = *(pollfd **)((long)thread_func_param + 0x10);
    stop_flag = (stop_flag_t *)((long)thread_func_param + 0x28);
    __mutex = (pthread_mutex_t *)((long)thread_func_param + 0x30);
    while (*stop_flag == 0) {
      uVar8 = *(uint *)((long)thread_func_param + 0x18);
      for (lVar9 = 0; (ulong)uVar8 << 3 != lVar9; lVar9 = lVar9 + 8) {
        *(undefined4 *)((long)&pfd->fd + lVar9) =
             *(undefined4 *)(*(long *)((long)thread_func_param + 8) + lVar9 * 8);
        *(undefined2 *)((long)&pfd->events + lVar9) = 1;
      }
      psVar10 = stop_flag;
      iVar3 = mg_poll(pfd,uVar8,200,stop_flag);
      if (0 < iVar3) {
        for (uVar11 = 0; uVar11 < *(uint *)((long)thread_func_param + 0x18); uVar11 = uVar11 + 1) {
          if ((*stop_flag == 0) && ((pfd[uVar11].revents & 1) != 0)) {
            lVar9 = *(long *)((long)thread_func_param + 8);
            len = 0x1c;
            local_18c = 1;
            so._0_8_ = 0;
            so.lsa._4_8_ = 0;
            so.lsa._12_8_ = 0;
            so.lsa._20_8_ = 0;
            so.rsa._0_8_ = 0;
            so.rsa._8_1_ = '\0';
            so.rsa._9_1_ = '\0';
            so.rsa._10_1_ = '\0';
            so.rsa._11_1_ = '\0';
            so.rsa._12_1_ = '\0';
            so.rsa._13_1_ = '\0';
            so.rsa._14_1_ = '\0';
            so.rsa._15_1_ = '\0';
            so.rsa._16_8_ = 0;
            so._56_8_ = 0;
            iVar3 = accept(*(int *)(lVar9 + uVar11 * 0x40),(sockaddr *)&so.rsa.sa,&len);
            so.sock = iVar3;
            if (iVar3 != -1) {
              iVar3 = check_acl((mg_context *)thread_func_param,&so.rsa);
              uVar8 = (uint)psVar10;
              if (iVar3 == 1) {
                lVar9 = lVar9 + uVar11 * 0x40;
                set_close_on_exec(so.sock,(mg_connection *)thread_func_param,ctx);
                uVar2 = so._56_8_;
                so.is_ssl = *(uchar *)(lVar9 + 0x3c);
                so._62_2_ = SUB82(uVar2,6);
                so.ssl_redir = *(uchar *)(lVar9 + 0x3d);
                iVar3 = getsockname(so.sock,(sockaddr *)&so.lsa.sa,&len);
                if (iVar3 != 0) {
                  piVar5 = __errno_location();
                  pcVar6 = strerror(*piVar5);
                  mg_cry_internal_wrap
                            ((mg_connection *)0x0,(mg_context *)thread_func_param,func,uVar8,
                             "%s: getsockname() failed: %s","accept_new_connection",pcVar6);
                }
                if ((so.lsa.sa.sa_family & 0xfff7) == 2) {
                  __optval = &local_18c;
                  iVar3 = setsockopt(so.sock,1,9,__optval,4);
                  uVar8 = (uint)__optval;
                  if (iVar3 != 0) {
                    piVar5 = __errno_location();
                    pcVar6 = strerror(*piVar5);
                    mg_cry_internal_wrap
                              ((mg_connection *)0x0,(mg_context *)thread_func_param,func_00,uVar8,
                               "%s: setsockopt(SOL_SOCKET SO_KEEPALIVE) failed: %s",
                               "accept_new_connection",pcVar6);
                  }
                }
                pcVar6 = *(char **)((long)thread_func_param + 0x283c8);
                if (((pcVar6 != (char *)0x0) && (*pcVar6 == '1')) && (pcVar6[1] == '\0')) {
                  src_addr[0] = '\x01';
                  src_addr[1] = '\0';
                  src_addr[2] = '\0';
                  src_addr[3] = '\0';
                  if ((so.lsa.sa.sa_family | 8) == 10) {
                    pcVar6 = src_addr;
                    iVar3 = setsockopt(so.sock,6,1,pcVar6,4);
                    uVar8 = (uint)pcVar6;
                    if (iVar3 != 0) {
                      piVar5 = __errno_location();
                      pcVar6 = strerror(*piVar5);
                      mg_cry_internal_wrap
                                ((mg_connection *)0x0,(mg_context *)thread_func_param,func_02,uVar8,
                                 "%s: setsockopt(IPPROTO_TCP TCP_NODELAY) failed: %s",
                                 "accept_new_connection",pcVar6);
                    }
                  }
                }
                set_non_blocking_mode(so.sock);
                so.in_use = '\0';
                pthread_mutex_lock(__mutex);
                while( true ) {
                  uVar8 = *(uint *)((long)thread_func_param + 0xec);
                  psVar10 = (stop_flag_t *)(ulong)uVar8;
                  iVar3 = *(int *)((long)thread_func_param + 0x80) -
                          *(int *)((long)thread_func_param + 0x84);
                  if ((*(int *)((long)thread_func_param + 0x28) != 0) || (iVar3 < (int)uVar8))
                  break;
                  *(undefined4 *)((long)thread_func_param + 0xe8) = 1;
                  pthread_cond_wait((pthread_cond_t *)((long)thread_func_param + 0xb8),__mutex);
                  *(undefined4 *)((long)thread_func_param + 0xe8) = 0;
                }
                if (iVar3 < (int)uVar8) {
                  lVar9 = *(long *)((long)thread_func_param + 0x78);
                  lVar7 = (long)(*(int *)((long)thread_func_param + 0x80) % (int)uVar8) * 0x40;
                  puVar1 = (undefined8 *)(lVar9 + 0x30 + lVar7);
                  *puVar1 = so.rsa._16_8_;
                  puVar1[1] = so._56_8_;
                  puVar1 = (undefined8 *)(lVar9 + 0x20 + lVar7);
                  *puVar1 = so.rsa._0_8_;
                  *(uchar (*) [8])(puVar1 + 1) = so.rsa.sin.sin_zero;
                  puVar1 = (undefined8 *)(lVar9 + 0x10 + lVar7);
                  *puVar1 = so.lsa._12_8_;
                  puVar1[1] = so.lsa._20_8_;
                  *(undefined8 *)(lVar9 + lVar7) = so._0_8_;
                  ((undefined8 *)(lVar9 + lVar7))[1] = so.lsa._4_8_;
                  *(int *)((long)thread_func_param + 0x80) =
                       *(int *)((long)thread_func_param + 0x80) + 1;
                }
                pthread_cond_signal((pthread_cond_t *)((long)thread_func_param + 0x88));
                pthread_mutex_unlock(__mutex);
              }
              else {
                sockaddr_to_string(src_addr,0x32,&so.rsa);
                mg_cry_internal_wrap
                          ((mg_connection *)0x0,(mg_context *)thread_func_param,func_01,
                           (uint)psVar10,"%s: %s is not allowed to connect","accept_new_connection",
                           src_addr);
                close(so.sock);
              }
            }
          }
        }
      }
    }
    close_all_listening_sockets((mg_context *)thread_func_param);
    pthread_mutex_lock(__mutex);
    pthread_cond_broadcast((pthread_cond_t *)((long)thread_func_param + 0x88));
    pthread_mutex_unlock(__mutex);
    uVar8 = *(uint *)((long)thread_func_param + 0x60);
    for (uVar11 = 0; uVar8 != uVar11; uVar11 = uVar11 + 1) {
      threadid = *(pthread_t *)(*(long *)((long)thread_func_param + 0x68) + uVar11 * 8);
      if (threadid != 0) {
        mg_join_thread(threadid);
      }
    }
    if (*(code **)((long)thread_func_param + 0x28390) != (code *)0x0) {
      (**(code **)((long)thread_func_param + 0x28390))(thread_func_param,0,local_118);
    }
    pthread_setspecific(sTlsKey,(void *)0x0);
    *stop_flag = 2;
  }
  return (void *)0x0;
}

Assistant:

static void *
master_thread(void *thread_func_param)
{
#if !defined(__ZEPHYR__)
	struct sigaction sa;

	/* Ignore SIGPIPE */
	memset(&sa, 0, sizeof(sa));
	sa.sa_handler = SIG_IGN;
	sigaction(SIGPIPE, &sa, NULL);
#endif

	master_thread_run((struct mg_context *)thread_func_param);
	return NULL;
}